

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

void KINPrintInfo(KINMem kin_mem,int info_code,char *module,char *fname,char *msgfmt,...)

{
  char in_AL;
  undefined8 uVar1;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char retstr [30];
  va_list ap;
  char msg1 [40];
  char msg [256];
  undefined8 local_248;
  char acStack_240 [9];
  undefined2 uStack_237;
  undefined1 uStack_235;
  undefined2 uStack_234;
  undefined1 uStack_232;
  undefined1 uStack_231;
  undefined1 uStack_230;
  undefined8 local_228;
  char *local_220;
  undefined1 *local_218;
  char local_208 [48];
  char local_1d8 [256];
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_218 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_228 = 0x3000000028;
  local_220 = retstr + 8;
  local_b0 = in_R9;
  if (info_code != 1) {
    vsprintf(local_1d8,msgfmt,&local_228);
    goto LAB_0010b812;
  }
  local_228 = 0x3000000030;
  switch((undefined4)local_b0) {
  case 0:
    local_248 = 0x434355535f4e494b;
    builtin_strncpy(acStack_240,"ESS",4);
    break;
  case 2:
    local_248 = 0x504554535f4e494b;
    builtin_strncpy(acStack_240,"_LT_STPTO",9);
    uStack_237 = 0x4c;
    break;
  case 0xfffffff1:
    local_248 = 0x545045525f4e494b;
    builtin_strncpy(acStack_240,"D_SYSF",6);
    uVar1 = 0x5252455f434e55;
    goto LAB_0010b73a;
  case 0xfffffff3:
    local_248 = 0x465359535f4e494b;
    builtin_strncpy(acStack_240,"UNC_FAIL",9);
    break;
  case 0xfffffff4:
    builtin_strncpy(acStack_240,"ONDSOLVE_",9);
    uStack_237 = 0x4146;
    uStack_235 = 0x49;
    uStack_234 = 0x554c;
    uStack_232 = 0x52;
    uStack_231 = 0x45;
    uStack_230 = 0;
    local_248 = 0x434552505f4e494b;
    break;
  case 0xfffffff5:
    local_248 = 0x434552505f4e494b;
    builtin_strncpy(acStack_240,"ONDSET_",7);
    uVar1 = 0x4552554c494146;
    goto LAB_0010b7e2;
  case 0xfffffff7:
    local_248 = 0x534e494c5f4e494b;
    builtin_strncpy(acStack_240,"OLV_NO_RE",9);
    uStack_237 = 0x4f43;
    uStack_235 = 0x56;
    uStack_234 = 0x5245;
    uStack_232 = 0x59;
    uStack_231 = 0;
    break;
  case 0xfffffff8:
    local_248 = 0x454e494c5f4e494b;
    builtin_strncpy(acStack_240,"SEARCH",6);
    uVar1 = 0x4c49414643425f;
LAB_0010b73a:
    acStack_240[6] = (char)uVar1;
    acStack_240[7] = (char)((ulong)uVar1 >> 8);
    acStack_240[8] = (char)((ulong)uVar1 >> 0x10);
    uStack_237 = (undefined2)((ulong)uVar1 >> 0x18);
    uStack_235 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_234 = (undefined2)((ulong)uVar1 >> 0x30);
    break;
  case 0xfffffff9:
    local_248 = 0x454e584d5f4e494b;
    builtin_strncpy(acStack_240,"WT_5X_E",7);
    uVar1 = 0x44454445454358;
    goto LAB_0010b7e2;
  case 0xfffffffa:
    local_248 = 0x4958414d5f4e494b;
    builtin_strncpy(acStack_240,"TER_REACH",9);
    uStack_237 = 0x4445;
    uStack_235 = 0;
    break;
  case 0xfffffffb:
    local_248 = 0x454e494c5f4e494b;
    builtin_strncpy(acStack_240,"SEARCH_",7);
    uVar1 = 0x564e4f434e4f4e;
LAB_0010b7e2:
    acStack_240[7] = (char)uVar1;
    acStack_240[8] = (char)((ulong)uVar1 >> 8);
    uStack_237 = (undefined2)((ulong)uVar1 >> 0x10);
    uStack_235 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_234 = (undefined2)((ulong)uVar1 >> 0x28);
    uStack_232 = 0;
  }
  sprintf(local_208,msgfmt);
  sprintf(local_1d8,"%s (%s)",local_208,&local_248);
LAB_0010b812:
  (*kin_mem->kin_ihfun)(module,fname,local_1d8,kin_mem->kin_ih_data);
  return;
}

Assistant:

void KINPrintInfo(KINMem kin_mem, 
                  int info_code, const char *module, const char *fname, 
                  const char *msgfmt, ...)
{
  va_list ap;
  char msg[256], msg1[40];
  char retstr[30];
  int ret;

  /* Initialize argument processing 
   (msgfrmt is the last required argument) */

  va_start(ap, msgfmt); 

  if (info_code == PRNT_RETVAL) {

    /* If info_code = PRNT_RETVAL, decode the numeric value */

    ret = va_arg(ap, int);

    switch(ret) {
    case KIN_SUCCESS:
      sprintf(retstr, "KIN_SUCCESS");
      break;
    case KIN_SYSFUNC_FAIL:
      sprintf(retstr, "KIN_SYSFUNC_FAIL");
      break;
    case KIN_REPTD_SYSFUNC_ERR:
      sprintf(retstr, "KIN_REPTD_SYSFUNC_ERR");
      break;
    case KIN_STEP_LT_STPTOL:
      sprintf(retstr, "KIN_STEP_LT_STPTOL");
      break;
    case KIN_LINESEARCH_NONCONV:
      sprintf(retstr, "KIN_LINESEARCH_NONCONV");
      break;
    case KIN_LINESEARCH_BCFAIL:
      sprintf(retstr, "KIN_LINESEARCH_BCFAIL");
      break;
    case KIN_MAXITER_REACHED:
      sprintf(retstr, "KIN_MAXITER_REACHED");
      break;
    case KIN_MXNEWT_5X_EXCEEDED:
      sprintf(retstr, "KIN_MXNEWT_5X_EXCEEDED");
      break;
    case KIN_LINSOLV_NO_RECOVERY:
      sprintf(retstr, "KIN_LINSOLV_NO_RECOVERY");
      break;
    case KIN_LSETUP_FAIL:
      sprintf(retstr, "KIN_PRECONDSET_FAILURE");
      break;
    case KIN_LSOLVE_FAIL:
      sprintf(retstr, "KIN_PRECONDSOLVE_FAILURE");
      break;
    }

    /* Compose the message */

    sprintf(msg1, msgfmt, ret);
    sprintf(msg,"%s (%s)",msg1,retstr);


  } else {
  
    /* Compose the message */

    vsprintf(msg, msgfmt, ap);

  }

  /* call the info message handler */

  ihfun(module, fname, msg, ih_data);

  /* finalize argument processing */

  va_end(ap);

  return;
}